

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_lsd<8u>(Cacheblock<8U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  void *__src;
  long lVar5;
  Cacheblock<8U> *pCVar6;
  size_t i;
  long lVar7;
  uchar *puVar8;
  size_t sVar9;
  Cacheblock<8U> *pCVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long local_1038 [256];
  long local_838 [257];
  
LAB_0019daff:
  pCVar6 = cache;
  if (0x1f < N) {
    fill_cache<8u>(cache,N,depth);
    for (uVar11 = 7; -1 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
      puVar8 = (cache->chars)._M_elems + uVar11;
      memset(local_1038 + 0x100,0,0x800);
      uVar4 = N;
      while (bVar13 = uVar4 != 0, uVar4 = uVar4 - 1, bVar13) {
        local_1038[(ulong)*puVar8 + 0x100] = local_1038[(ulong)*puVar8 + 0x100] + 1;
        puVar8 = puVar8 + 0x10;
      }
      __src = malloc(N << 4);
      local_1038[0] = 0;
      lVar5 = 0;
      for (lVar7 = 1; pCVar6 = cache, uVar4 = N, lVar7 != 0x100; lVar7 = lVar7 + 1) {
        lVar5 = lVar5 + local_1038[lVar7 + 0xff];
        local_1038[lVar7] = lVar5;
      }
      while (uVar4 != 0) {
        bVar2 = (pCVar6->chars)._M_elems[uVar11];
        lVar7 = local_1038[bVar2];
        local_1038[bVar2] = lVar7 + 1;
        puVar8 = pCVar6->ptr;
        puVar1 = (undefined8 *)((long)__src + lVar7 * 0x10);
        *puVar1 = *(undefined8 *)(pCVar6->chars)._M_elems;
        puVar1[1] = puVar8;
        pCVar6 = pCVar6 + 1;
        uVar4 = uVar4 - 1;
      }
      memcpy(cache,__src,N << 4);
      free(__src);
    }
    depth = depth + 8;
    lVar7 = 0;
    do {
      lVar12 = lVar7;
      pCVar6 = cache + lVar12;
      lVar5 = -1;
      while( true ) {
        if (lVar12 - N == lVar5) {
          N = -lVar5;
          if (N == 0 || lVar5 == -1) {
            return;
          }
          pCVar6 = cache + lVar12;
          cache = cache + lVar12;
          if ((pCVar6->chars)._M_elems[7] == '\0') {
            return;
          }
          goto LAB_0019daff;
        }
        if (*(long *)(pCVar6->chars)._M_elems != *(long *)pCVar6[1].chars._M_elems) break;
        lVar5 = lVar5 + -1;
        pCVar6 = pCVar6 + 1;
      }
      lVar7 = lVar12 - lVar5;
      if ((1 < (ulong)-lVar5) && (cache[lVar12].chars._M_elems[7] != '\0')) {
        msd_lsd<8u>(cache + lVar12,-lVar5,depth);
      }
    } while( true );
  }
  do {
    if ((int)N < 2) {
      return;
    }
    N = (size_t)((int)N - 1);
    puVar8 = pCVar6[1].ptr;
    for (pCVar10 = pCVar6 + 1; cache < pCVar10; pCVar10 = pCVar10 + -1) {
      sVar9 = depth;
      while( true ) {
        bVar2 = pCVar10[-1].ptr[sVar9];
        bVar3 = puVar8[sVar9];
        if ((bVar2 == 0) || (bVar2 != bVar3)) break;
        sVar9 = sVar9 + 1;
      }
      if (bVar2 <= bVar3) break;
      pCVar10->ptr = pCVar10[-1].ptr;
    }
    pCVar10->ptr = puVar8;
    pCVar6 = pCVar6 + 1;
  } while( true );
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}